

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

void __thiscall
kj::_::
DisposableOwnedBundle<kj::Own<kj::(anonymous_namespace)::NullInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>
::disposeImpl(DisposableOwnedBundle<kj::Own<kj::(anonymous_namespace)::NullInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>
              *this,void *pointer)

{
  NullInputStream *pNVar1;
  Disposer *pDVar2;
  char *pcVar3;
  size_t sVar4;
  ArrayDisposer *pAVar5;
  
  pNVar1 = (this->
           super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::NullInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>
           ).first.ptr;
  if (pNVar1 != (NullInputStream *)0x0) {
    (this->
    super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::NullInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>
    ).first.ptr = (NullInputStream *)0x0;
    pDVar2 = (this->
             super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::NullInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>
             ).first.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(pNVar1->super_AsyncInputStream)._vptr_AsyncInputStream[-2] +
                      (long)&(pNVar1->super_AsyncInputStream)._vptr_AsyncInputStream);
  }
  pcVar3 = (this->
           super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::NullInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>
           ).super_OwnedBundle<kj::String,_kj::Own<kj::HttpHeaders>_>.first.content.ptr;
  if (pcVar3 != (char *)0x0) {
    sVar4 = (this->
            super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::NullInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>
            ).super_OwnedBundle<kj::String,_kj::Own<kj::HttpHeaders>_>.first.content.size_;
    (this->
    super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::NullInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>
    ).super_OwnedBundle<kj::String,_kj::Own<kj::HttpHeaders>_>.first.content.ptr = (char *)0x0;
    (this->
    super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::NullInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>
    ).super_OwnedBundle<kj::String,_kj::Own<kj::HttpHeaders>_>.first.content.size_ = 0;
    pAVar5 = (this->
             super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::NullInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>
             ).super_OwnedBundle<kj::String,_kj::Own<kj::HttpHeaders>_>.first.content.disposer;
    (**pAVar5->_vptr_ArrayDisposer)(pAVar5,pcVar3,1,sVar4,sVar4,0);
  }
  if ((this->
      super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::NullInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>
      ).super_OwnedBundle<kj::String,_kj::Own<kj::HttpHeaders>_>.
      super_OwnedBundle<kj::Own<kj::HttpHeaders>_>.first.ptr != (HttpHeaders *)0x0) {
    (this->
    super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::NullInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>
    ).super_OwnedBundle<kj::String,_kj::Own<kj::HttpHeaders>_>.
    super_OwnedBundle<kj::Own<kj::HttpHeaders>_>.first.ptr = (HttpHeaders *)0x0;
    (**((this->
        super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::NullInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>
        ).super_OwnedBundle<kj::String,_kj::Own<kj::HttpHeaders>_>.
        super_OwnedBundle<kj::Own<kj::HttpHeaders>_>.first.disposer)->_vptr_Disposer)();
  }
  operator_delete(this,0x40);
  return;
}

Assistant:

void disposeImpl(void* pointer) const override { delete this; }